

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlPatternMinDepth(xmlPatternPtr comp)

{
  int iVar1;
  int iVar2;
  
  if (comp != (xmlPatternPtr)0x0) {
    iVar2 = 0xbc614e;
    while (comp->stream != (xmlStreamCompPtr)0x0) {
      iVar1 = comp->stream->nbStep;
      if (iVar1 < iVar2) {
        iVar2 = iVar1;
      }
      if (iVar2 == 0) {
        return 0;
      }
      comp = comp->next;
      if (comp == (_xmlPattern *)0x0) {
        return iVar2;
      }
    }
  }
  return -1;
}

Assistant:

int
xmlPatternMinDepth(xmlPatternPtr comp) {
    int ret = 12345678;
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(-1);
	if (comp->stream->nbStep < ret)
	    ret = comp->stream->nbStep;
	if (ret == 0)
	    return(0);
	comp = comp->next;
    }
    return(ret);
}